

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtualfileentry.cpp
# Opt level: O1

void __thiscall sai::VirtualFileEntry::Seek(VirtualFileEntry *this,size_t NewOffset)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  ulong uVar4;
  bool bVar5;
  VirtualPage VStack_1028;
  
  this_00 = (this->FileStream).super___weak_ptr<sai::ifstream,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    iVar2 = this_00->_M_use_count;
    do {
      if (iVar2 == 0) {
        this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        break;
      }
      LOCK();
      iVar1 = this_00->_M_use_count;
      bVar5 = iVar2 == iVar1;
      if (bVar5) {
        this_00->_M_use_count = iVar2 + 1;
        iVar1 = iVar2;
      }
      iVar2 = iVar1;
      UNLOCK();
    } while (!bVar5);
  }
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    bVar5 = false;
  }
  else {
    bVar5 = this_00->_M_use_count != 0;
  }
  if (((bVar5) &&
      ((this->FileStream).super___weak_ptr<sai::ifstream,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
       (element_type *)0x0)) && (NewOffset < (this->FATData).Size)) {
    this->Offset = NewOffset;
    this->PageOffset = (ulong)((uint)NewOffset & 0xfff);
    this->PageIndex = (ulong)(this->FATData).PageIndex;
    if (0xfff < NewOffset) {
      uVar4 = NewOffset >> 0xc;
      do {
        GetTablePage(&VStack_1028,this,this->PageIndex);
        uVar3 = (ulong)*(uint *)((long)&VStack_1028 + (ulong)((uint)this->PageIndex & 0x1ff) * 8 + 4
                                );
        if (uVar3 == 0) break;
        this->PageIndex = uVar3;
        uVar4 = uVar4 - 1;
      } while (uVar4 != 0);
    }
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return;
}

Assistant:

void VirtualFileEntry::Seek(std::size_t NewOffset)
{
	if( std::shared_ptr<ifstream> Stream = FileStream.lock() )
	{
		if( NewOffset >= FATData.Size )
		{
			// Invalid offset
			return;
		}
		Offset     = NewOffset;
		PageOffset = NewOffset % VirtualPage::PageSize;
		PageIndex  = FATData.PageIndex;
		for( std::size_t i = 0; i < NewOffset / VirtualPage::PageSize; ++i )
		{
			// Get the next page index in the page-chain
			const std::uint32_t NextPageIndex = GetTablePage(PageIndex)
													.PageEntries[PageIndex % VirtualPage::TableSpan]
													.NextPageIndex;
			if( NextPageIndex )
			{
				PageIndex = NextPageIndex;
			}
			else
			{
				break;
			}
		}
	}
}